

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::createAccessChain(Builder *this,StorageClass storageClass,Id base,Vector<Id> *offsets)

{
  pointer ppIVar1;
  iterator __position;
  Block *pBVar2;
  uint uVar3;
  Id IVar4;
  Id IVar5;
  Instruction *pIVar6;
  pointer puVar7;
  uint member;
  long lVar8;
  Instruction *raw_instruction;
  uint local_3c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  ppIVar1 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ppIVar1[base]->typeId;
  if ((ppIVar1[uVar3]->opCode == OpTypePointer) &&
     ((offsets->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (offsets->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start)) {
    uVar3 = getContainedTypeId(this,uVar3,0);
    puVar7 = (offsets->
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(offsets->
                                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)puVar7) >> 2)) {
      lVar8 = 0;
      do {
        ppIVar1 = (this->module).idToInstruction.
                  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        member = puVar7[lVar8];
        if (ppIVar1[uVar3]->opCode == OpTypeStruct) {
          pIVar6 = ppIVar1[member];
          if (pIVar6->opCode != OpConstant) {
            __assert_fail("isConstantScalar(offsets[i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                          ,0x509,
                          "Id spv::Builder::createAccessChain(StorageClass, Id, const dxil_spv::Vector<Id> &)"
                         );
          }
          member = *(pIVar6->operands).
                    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
        uVar3 = getContainedTypeId(this,uVar3,member);
        lVar8 = lVar8 + 1;
        puVar7 = (offsets->
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      } while (lVar8 < (int)((ulong)((long)(offsets->
                                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)puVar7) >> 2));
    }
    IVar4 = makePointer(this,storageClass,uVar3);
    pIVar6 = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
    IVar5 = this->uniqueId + 1;
    this->uniqueId = IVar5;
    pIVar6->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar6->resultId = IVar5;
    pIVar6->typeId = IVar4;
    pIVar6->opCode = OpAccessChain;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIVar6->block = (Block *)0x0;
    local_3c = base;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,(iterator)0x0,&local_3c);
    puVar7 = (offsets->
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(offsets->
                                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)puVar7) >> 2)) {
      lVar8 = 0;
      do {
        local_3c = puVar7[lVar8];
        __position._M_current =
             (pIVar6->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pIVar6->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                     &pIVar6->operands,__position,&local_3c);
          puVar7 = (offsets->
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        }
        else {
          *__position._M_current = local_3c;
          (pIVar6->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (int)((ulong)((long)(offsets->
                                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)puVar7) >> 2));
    }
    pBVar2 = this->buildPoint;
    local_38._M_head_impl = pIVar6;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&pBVar2->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
    pIVar6->block = pBVar2;
    if (pIVar6->resultId != 0) {
      Module::mapInstruction(pBVar2->parent->parent,pIVar6);
    }
    if (local_38._M_head_impl != (Instruction *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Instruction[1])();
    }
    return pIVar6->resultId;
  }
  __assert_fail("isPointerType(typeId) && offsets.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                ,0x505,
                "Id spv::Builder::createAccessChain(StorageClass, Id, const dxil_spv::Vector<Id> &)"
               );
}

Assistant:

Id Builder::createAccessChain(StorageClass storageClass, Id base, const dxil_spv::Vector<Id>& offsets)
{
    // Figure out the final resulting type.
    spv::Id typeId = getTypeId(base);
    assert(isPointerType(typeId) && offsets.size() > 0);
    typeId = getContainedTypeId(typeId);
    for (int i = 0; i < (int)offsets.size(); ++i) {
        if (isStructType(typeId)) {
            assert(isConstantScalar(offsets[i]));
            typeId = getContainedTypeId(typeId, getConstantScalar(offsets[i]));
        } else
            typeId = getContainedTypeId(typeId, offsets[i]);
    }
    typeId = makePointer(storageClass, typeId);

    // Make the instruction
    Instruction* chain = new Instruction(getUniqueId(), typeId, OpAccessChain);
    chain->addIdOperand(base);
    for (int i = 0; i < (int)offsets.size(); ++i)
        chain->addIdOperand(offsets[i]);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(chain));

    return chain->getResultId();
}